

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfftpack.c
# Opt level: O3

int dct1_forward(fft_t *f,double *data)

{
  int ier;
  
  ier = -1;
  if ((data != (double *)0x0 && f != (fft_t *)0x0) && (ier = -2, f->algo == 4)) {
    ier = 0;
    if (f->ortho == 0) {
      cost1f_(&f->n,&f->inc,data,&f->n,f->save,&f->lensav,f->work,&f->lenwork,&ier);
    }
    else {
      ier = cfftpack_orthogonal_dct1(f,data);
    }
  }
  return ier;
}

Assistant:

int dct1_forward(fft_t *f, fft_real_t *data){
  if (!f || !data)
    return -1;
  if (f->algo != ALGO_DCT1)
    return -2;
  int ier=0;
  if (!f->ortho){
    // forward DCT-I
    cost1f_(&f->n, &f->inc, data, &f->n, f->save, &f->lensav, f->work, &f->lenwork, &ier);
    if (ier)
      return ier;
  }else{
    return cfftpack_orthogonal_dct1(f,data);
  }
  return 0;
}